

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_glaciate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ROOM_INDEX_DATA *room;
  char *txt;
  ROOM_AFFECT_DATA raf;
  
  room = ch->in_room;
  if (room->sector_type == 6) {
    if (room->area->temp != 0) {
      init_affect_room(&raf);
      raf.where = 0;
      raf.type = gsn_glaciate;
      raf.aftype = 0;
      raf.level = (short)level;
      raf.duration = (short)(level / 7) + 3;
      raf.location = 3;
      raf.modifier = 0x12 - ch->in_room->sector_type;
      raf.end_fun = glaciate_melt;
      raf.tick_fun = (RAFF_FUN *)0x0;
      raf.owner = ch;
      new_affect_to_room(room,&raf);
      act("The water beneath you suddenly congeals into glacial ice.",ch,(void *)0x0,(void *)0x0,3);
      return;
    }
    txt = "The ambient temperature is too high to freeze the water.\n\r";
  }
  else {
    txt = "You must be on the surface of water to cast this spell.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_glaciate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	ROOM_INDEX_DATA *room = ch->in_room;
	ROOM_AFFECT_DATA raf;

	if (room->sector_type != SECT_WATER)
	{
		send_to_char("You must be on the surface of water to cast this spell.\n\r", ch);
		return;
	}

	if (room->area->temp == Temperature::Hot)
	{
		send_to_char("The ambient temperature is too high to freeze the water.\n\r", ch);
		return;
	}

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.type = gsn_glaciate;
	raf.aftype = AFT_SPELL;
	raf.level = level;
	raf.duration = 3 + level / 7;
	raf.location = APPLY_ROOM_SECT;
	raf.modifier = SECT_ICE - ch->in_room->sector_type;
	raf.owner = ch;
	raf.end_fun = glaciate_melt;
	raf.tick_fun = nullptr;
	new_affect_to_room(room, &raf);

	act("The water beneath you suddenly congeals into glacial ice.", ch, 0, 0, TO_CHAR);
}